

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdBool32x4OperationX86X64.cpp
# Opt level: O3

bool Js::SIMDBool32x4Operation::OpAllTrue<short>(SIMDValue *simd)

{
  undefined1 auVar1 [16];
  
  auVar1._0_2_ = -(ushort)((simd->field_0).i16[0] == 0);
  auVar1._2_2_ = -(ushort)((simd->field_0).i16[1] == 0);
  auVar1._4_2_ = -(ushort)((simd->field_0).i16[2] == 0);
  auVar1._6_2_ = -(ushort)((simd->field_0).i16[3] == 0);
  auVar1._8_2_ = -(ushort)((simd->field_0).i16[4] == 0);
  auVar1._10_2_ = -(ushort)((simd->field_0).i16[5] == 0);
  auVar1._12_2_ = -(ushort)((simd->field_0).i16[6] == 0);
  auVar1._14_2_ = -(ushort)((simd->field_0).i16[7] == 0);
  return (((((((((((((((auVar1 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar1 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar1 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar1 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar1 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar1 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar1 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar1 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar1 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar1 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar1 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar1 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar1 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar1 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar1._14_2_ >> 7 & 1) == 0) && (auVar1._14_2_ & 0x8000) == 0;
}

Assistant:

bool SIMDBool32x4Operation::OpAllTrue(const SIMDValue& simd)
    {
        SIMDValue canonSimd = SIMDUtils::CanonicalizeToBools<T>(simd); //copy-by-value since we need to modify the copy
        X86SIMDValue x86Simd = X86SIMDValue::ToX86SIMDValue(canonSimd);
        int mask_8 = _mm_movemask_epi8(x86Simd.m128i_value); //latency 3, throughput 1
        return mask_8 == 0xFFFF;
    }